

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void * base_alloc_impl(tsdn_t *tsdn,base_t *base,size_t size,size_t alignment,size_t *esn,
                      size_t *ret_usize)

{
  size_t sVar1;
  uint uVar2;
  base_t *base_00;
  base_block_t *pbVar3;
  void *gap_size_00;
  edata_heap_t *ph;
  size_t *size_00;
  size_t *duckdb_je_extent_sn_next;
  ulong size_01;
  ulong uVar4;
  size_t gap_size;
  size_t in_stack_ffffffffffffffa0;
  edata_t *local_38;
  
  size_01 = alignment + 0xf & 0xfffffffffffffff0;
  duckdb_je_extent_sn_next = (size_t *)(-size_01 & (size + size_01) - 1);
  uVar4 = (long)duckdb_je_extent_sn_next + (size_01 - 0x10);
  size_00 = ret_usize;
  malloc_mutex_lock(tsdn,&base->mtx);
  if (uVar4 < 0x1001) {
    uVar2 = (uint)duckdb_je_sz_size2index_tab[(long)duckdb_je_extent_sn_next + (size_01 - 9) >> 3];
  }
  else {
    uVar2 = sz_size2index_compute(uVar4);
  }
  uVar4 = (ulong)uVar2 - 1;
  ph = base->avail + uVar2;
  do {
    uVar4 = uVar4 + 1;
    if (0xe7 < uVar4) {
      (base->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(base->mtx).field_0 + 0x48));
      size_00 = duckdb_je_extent_sn_next;
      pbVar3 = base_block_alloc(tsdn,base,&base->ehooks_base,(int)base + 0x94,
                                (pszind_t *)&base->duckdb_je_extent_sn_next,duckdb_je_extent_sn_next
                                ,size_01,in_stack_ffffffffffffffa0);
      malloc_mutex_lock(tsdn,&base->mtx);
      if (pbVar3 == (base_block_t *)0x0) {
        gap_size_00 = (void *)0x0;
        goto LAB_01f8ab56;
      }
      pbVar3->next = base->blocks;
      base->blocks = pbVar3;
      base->allocated = base->allocated + 0x90;
      sVar1 = pbVar3->size;
      base->resident = base->resident + 0x1000;
      base->mapped = sVar1 + base->mapped;
      if (((duckdb_je_opt_metadata_thp != metadata_thp_disabled) &&
          (duckdb_je_init_system_thp_mode == thp_mode_default)) &&
         ((duckdb_je_opt_metadata_thp != metadata_thp_auto || (base->auto_thp_switched == true)))) {
        base->n_thp = base->n_thp + 1;
      }
      base_00 = (base_t *)&pbVar3->edata;
      break;
    }
    base_00 = (base_t *)duckdb_je_edata_heap_remove_first(ph);
    ph = ph + 1;
  } while (base_00 == (base_t *)0x0);
  gap_size_00 = base_extent_bump_alloc_helper
                          ((edata_t *)base_00,(size_t *)&local_38,(size_t)duckdb_je_extent_sn_next,
                           size_01);
  base_extent_bump_alloc_post
            ((tsdn_t *)base,base_00,local_38,(size_t)gap_size_00,duckdb_je_extent_sn_next,
             (size_t)size_00);
  if (esn != (size_t *)0x0) {
    *esn = (base_00->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  }
  if (ret_usize != (size_t *)0x0) {
    *ret_usize = (size_t)duckdb_je_extent_sn_next;
  }
LAB_01f8ab56:
  (base->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(base->mtx).field_0 + 0x48));
  return gap_size_00;
}

Assistant:

static void *
base_alloc_impl(tsdn_t *tsdn, base_t *base, size_t size, size_t alignment,
    size_t *esn, size_t *ret_usize) {
	alignment = QUANTUM_CEILING(alignment);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t asize = usize + alignment - QUANTUM;

	edata_t *edata = NULL;
	malloc_mutex_lock(tsdn, &base->mtx);
	for (szind_t i = sz_size2index(asize); i < SC_NSIZES; i++) {
		edata = edata_heap_remove_first(&base->avail[i]);
		if (edata != NULL) {
			/* Use existing space. */
			break;
		}
	}
	if (edata == NULL) {
		/* Try to allocate more space. */
		edata = base_extent_alloc(tsdn, base, usize, alignment);
	}
	void *ret;
	if (edata == NULL) {
		ret = NULL;
		goto label_return;
	}

	ret = base_extent_bump_alloc(tsdn, base, edata, usize, alignment);
	if (esn != NULL) {
		*esn = (size_t)edata_sn_get(edata);
	}
	if (ret_usize != NULL) {
		*ret_usize = usize;
	}
label_return:
	malloc_mutex_unlock(tsdn, &base->mtx);
	return ret;
}